

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_inx_clears_n_flag_Test::~CpuTest_inx_clears_n_flag_Test
          (CpuTest_inx_clears_n_flag_Test *this)

{
  CpuTest_inx_clears_n_flag_Test *this_local;
  
  ~CpuTest_inx_clears_n_flag_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, inx_clears_n_flag) {
    stage_instruction(INX);
    registers.x = 255;
    registers.p |= N_FLAG;
    expected.x = 0;
    expected.p |= Z_FLAG;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}